

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssse3_gemm.h
# Opt level: O2

void intgemm::SSSE3::Kernels8::PrepareBTransposed
               (float *input,int8_t *output,float quant_mult,Index cols,Index rows)

{
  int8_t *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Index in_R8D;
  long lVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined8 in_XMM1_Qa;
  FRegister mult_reg;
  int8_t *local_58;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  
  uVar3 = 0;
  uVar2 = 0;
  local_58 = output;
  while (uVar3 < rows) {
    uVar4 = cols * uVar3;
    for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 0x10) {
      mult_reg[1] = quant_mult;
      mult_reg[0] = quant_mult;
      mult_reg[2] = (float)(int)in_XMM1_Qa;
      mult_reg[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
      QuantizeTile8::ConsecutiveWithWrapping
                ((QuantizeTile8 *)(input + (ulong)uVar2 + (ulong)uVar4),mult_reg,
                 (float *)(ulong)(cols - uVar2),cols,8,in_R8D);
      piVar1 = local_58 + lVar5;
      *(undefined4 *)piVar1 = extraout_XMM0_Da;
      *(undefined4 *)(piVar1 + 4) = extraout_XMM0_Db;
      *(undefined4 *)(piVar1 + 8) = extraout_XMM0_Dc;
      *(undefined4 *)(piVar1 + 0xc) = extraout_XMM0_Dd;
      uVar4 = uVar4 + cols;
    }
    local_58 = local_58 + 0x80;
    uVar2 = uVar2 + 0x10;
    while (cols <= uVar2) {
      uVar3 = uVar3 + 8;
      uVar2 = uVar2 - cols;
    }
  }
  return;
}

Assistant:

INTGEMM_SSSE3 static void SelectColumnsB(const int8_t *input, int8_t *output, Index rows, const Index *cols_begin, const Index *cols_end) {
    SSSE3::SelectColumnsOfB((const __m128i*)input, (__m128i*)output, rows, cols_begin, cols_end);
  }